

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void __thiscall wasm_functype_t::wasm_functype_t(wasm_functype_t *this,FuncType *ft)

{
  unique_ptr<wabt::interp::FuncType,_std::default_delete<wabt::interp::FuncType>_> local_28;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_20;
  FuncType *local_18;
  FuncType *ft_local;
  wasm_functype_t *this_local;
  
  local_18 = ft;
  ft_local = (FuncType *)this;
  wabt::MakeUnique<wabt::interp::FuncType,wabt::interp::FuncType&>((wabt *)&local_28,ft);
  std::unique_ptr<wabt::interp::ExternType,std::default_delete<wabt::interp::ExternType>>::
  unique_ptr<wabt::interp::FuncType,std::default_delete<wabt::interp::FuncType>,void>
            ((unique_ptr<wabt::interp::ExternType,std::default_delete<wabt::interp::ExternType>> *)
             &local_20,&local_28);
  wasm_externtype_t::wasm_externtype_t(&this->super_wasm_externtype_t,&local_20);
  std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
  ~unique_ptr(&local_20);
  std::unique_ptr<wabt::interp::FuncType,_std::default_delete<wabt::interp::FuncType>_>::~unique_ptr
            (&local_28);
  (this->super_wasm_externtype_t)._vptr_wasm_externtype_t =
       (_func_int **)&PTR__wasm_functype_t_00392be8;
  FromWabtValueTypes(&ft->params,&this->params);
  FromWabtValueTypes(&ft->results,&this->results);
  return;
}

Assistant:

wasm_functype_t(FuncType ft) : wasm_externtype_t{MakeUnique<FuncType>(ft)} {
    FromWabtValueTypes(ft.params, &params);
    FromWabtValueTypes(ft.results, &results);
  }